

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.h
# Opt level: O3

void __thiscall
lf::io::VtkWriter::
CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>>
          (VtkWriter *this,
          vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>
          *data,string *name)

{
  pointer __s;
  __normal_iterator<const_boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_*,_std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>_>
  _Var1;
  void *pvVar2;
  undefined8 *puVar3;
  uint *local_58;
  undefined8 local_50;
  uint local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>const*,std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>>,__gnu_cxx::__ops::_Iter_pred<lf::io::VtkWriter::CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>>(std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>const&,std::__cxx11::string_const&)::_lambda(auto:1&)_1_>>
                    ((data->
                     super__Vector_base<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (data->
                     super__Vector_base<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current !=
      (data->
      super__Vector_base<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    std::operator+(&local_38,"There is already another Point/Cell Attribute Set with the name ",name
                  );
    *puVar3 = &PTR__LfException_004d4a40;
    puVar3[1] = puVar3 + 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      *(undefined4 *)(puVar3 + 3) = local_38.field_2._M_allocated_capacity._0_4_;
      *(undefined4 *)((long)puVar3 + 0x1c) = local_38.field_2._M_allocated_capacity._4_4_;
      *(undefined4 *)(puVar3 + 4) = local_38.field_2._8_4_;
      *(undefined4 *)((long)puVar3 + 0x24) = local_38.field_2._12_4_;
    }
    else {
      puVar3[1] = local_38._M_dataplus._M_p;
      puVar3[3] = CONCAT44(local_38.field_2._M_allocated_capacity._4_4_,
                           local_38.field_2._M_allocated_capacity._0_4_);
    }
    puVar3[2] = local_38._M_string_length;
    local_38._M_string_length = 0;
    local_38.field_2._M_allocated_capacity._0_4_ =
         local_38.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    __cxa_throw(puVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  if (name->_M_string_length != 0) {
    __s = (name->_M_dataplus)._M_p;
    pvVar2 = memchr(__s,0x20,name->_M_string_length);
    if ((long)pvVar2 - (long)__s != -1 && pvVar2 != (void *)0x0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"The name of the attribute set cannot contain spaces!","");
      *puVar3 = &PTR__LfException_004d4a40;
      puVar3[1] = puVar3 + 3;
      if (local_58 == &local_48) {
        *(uint *)(puVar3 + 3) = local_48;
        *(undefined4 *)((long)puVar3 + 0x1c) = uStack_44;
        *(undefined4 *)(puVar3 + 4) = uStack_40;
        *(undefined4 *)((long)puVar3 + 0x24) = uStack_3c;
      }
      else {
        puVar3[1] = local_58;
        puVar3[3] = CONCAT44(uStack_44,local_48);
      }
      puVar3[2] = local_50;
      local_50 = 0;
      local_48 = local_48 & 0xffffff00;
      local_58 = &local_48;
      __cxa_throw(puVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
  }
  return;
}

Assistant:

void VtkWriter::CheckAttributeSetName(const DATA& data,
                                      const std::string& name) {
  if (std::find_if(data.begin(), data.end(), [&](auto& d) {
        return boost::apply_visitor([&](auto&& d2) { return d2.name; }, d) ==
               name;
      }) != data.end()) {
    throw base::LfException(
        "There is already another Point/Cell Attribute Set with the "
        "name " +
        name);
  }
  if (name.find(' ') != std::string::npos) {
    throw base::LfException(
        "The name of the attribute set cannot contain spaces!");
  }
}